

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week10-app1.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"----",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  print<int,_int>(5,10);
  return 0;
}

Assistant:

int main(int, char* [])
{
    auto i = func(); // i is int, its value is 40

//    std::cout << is_integral<float>::value << std::endl; // false
//    std::cout << is_integral<int>::value << std::endl; // true
    std::cout << is_integral_v<float> << std::endl; // false
    std::cout << is_integral_v<int> << std::endl; // true

//    std::cout << "func: " << IS_INTEGRAL(float()) << std::endl; // false
//    std::cout << "func: " << IS_INTEGRAL(int()) << std::endl; // true

//    std::cout << is_same<int, float>::value << std::endl; // false
//    std::cout << is_same<double, double>::value << std::endl; // true
    std::cout << is_same_v<int, float> << std::endl; // false
    std::cout << is_same_v<double, double> << std::endl; // true

//    TypeDisplayer< conditional<false, int, float>::type > a;
//    TypeDisplayer< conditional_t<false, int, float> > a;

    std::cout << "----" << std::endl;
    print(5, 10); //, std::string("Hello"), 3.14);
//    print(short(5));
//    print(long(5));
//    print('5');
//    print(5.5);
//    print(5.5f);
//    print("Hi there");

    return 0;
}